

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::queryAttributeState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  bool bVar1;
  char *msg;
  StateQueryMemoryWriteGuard<int> value;
  StateQueryMemoryWriteGuard<float> local_28;
  
  if (3 < type - QUERY_ATTRIBUTE_INTEGER) {
    return;
  }
  switch(type) {
  case QUERY_ATTRIBUTE_INTEGER:
    local_28.m_preguard = -8.0297587e+18;
    local_28.m_value = -8.0297587e+18;
    local_28.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetVertexAttribiv(gl,index,target,(GLint *)&local_28.m_value);
    msg = "glGetVertexAttribiv";
    break;
  case QUERY_ATTRIBUTE_FLOAT:
    local_28.m_preguard = -8.0297587e+18;
    local_28.m_value = -8.0297587e+18;
    local_28.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetVertexAttribfv(gl,index,target,&local_28.m_value);
    bVar1 = checkError(result,gl,"glGetVertexAttribfv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<float>::verifyValidity(&local_28,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_FLOAT;
    (state->m_v).vInt = (GLint)local_28.m_value;
    return;
  case QUERY_ATTRIBUTE_PURE_INTEGER:
    local_28.m_preguard = -8.0297587e+18;
    local_28.m_value = -8.0297587e+18;
    local_28.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetVertexAttribIiv(gl,index,target,(GLint *)&local_28.m_value);
    msg = "glGetVertexAttribIiv";
    break;
  case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
    local_28.m_preguard = -8.0297587e+18;
    local_28.m_value = -8.0297587e+18;
    local_28.m_postguard = -8.0297587e+18;
    glu::CallLogWrapper::glGetVertexAttribIuiv(gl,index,target,(GLuint *)&local_28.m_value);
    bVar1 = checkError(result,gl,"glGetVertexAttribIuiv");
    if (!bVar1) {
      return;
    }
    bVar1 = StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<unsigned_int> *)&local_28,result);
    if (!bVar1) {
      return;
    }
    state->m_type = DATATYPE_UNSIGNED_INTEGER;
    goto LAB_007db3aa;
  }
  bVar1 = checkError(result,gl,msg);
  if ((bVar1) &&
     (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                        ((StateQueryMemoryWriteGuard<int> *)&local_28,result), bVar1)) {
    state->m_type = DATATYPE_INTEGER;
LAB_007db3aa:
    (state->m_v).vInt = (GLint)local_28.m_value;
  }
  return;
}

Assistant:

void queryAttributeState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ATTRIBUTE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_FLOAT:
		{
			StateQueryMemoryWriteGuard<glw::GLfloat> value;
			gl.glGetVertexAttribfv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribfv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetVertexAttribIiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		case QUERY_ATTRIBUTE_PURE_UNSIGNED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLuint> value;
			gl.glGetVertexAttribIuiv(index, target, &value);

			if (!checkError(result, gl, "glGetVertexAttribIuiv"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}